

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O2

void __thiscall
deci_FlexLexer::switch_streams(deci_FlexLexer *this,istream *new_in,ostream *new_out)

{
  int iVar1;
  undefined4 extraout_var;
  yy_buffer_state *pyVar2;
  
  if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
    pyVar2 = (yy_buffer_state *)0x0;
  }
  else {
    pyVar2 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  }
  (*(this->super_FlexLexer)._vptr_FlexLexer[5])(this,pyVar2);
  iVar1 = (*(this->super_FlexLexer)._vptr_FlexLexer[4])(this,new_in,0x4000);
  (*(this->super_FlexLexer)._vptr_FlexLexer[2])(this,CONCAT44(extraout_var,iVar1));
  std::ios::rdbuf((streambuf *)(&this->yyout + *(long *)(*(long *)&this->yyout + -0x18)));
  return;
}

Assistant:

void yyFlexLexer::switch_streams( std::istream& new_in, std::ostream& new_out )
{
	// was if( new_in )
	yy_delete_buffer( YY_CURRENT_BUFFER );
	yy_switch_to_buffer( yy_create_buffer( new_in, YY_BUF_SIZE  ) );

	// was if( new_out )
	yyout.rdbuf(new_out.rdbuf());
}